

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void embarrasing_starvation(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  Enum EVar2;
  undefined1 *puVar3;
  char *in_RDI;
  double __x;
  double __x_00;
  Expression_lhs<const_unsigned_long_&> EVar4;
  Expression_lhs<const_unsigned_long> EVar5;
  ResultBuilder DOCTEST_RB_1;
  size_t b;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> barrier;
  Executor executor;
  Taskflow parent;
  Taskflow taskflow;
  ResultBuilder DOCTEST_RB;
  size_t B;
  Result *pRVar6;
  undefined4 in_stack_fffffffffffffa80;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffa84;
  Executor *in_stack_fffffffffffffa88;
  int line;
  char *in_stack_fffffffffffffa90;
  char *file;
  undefined8 in_stack_fffffffffffffa98;
  Enum at;
  undefined4 in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  undefined4 in_stack_fffffffffffffab0;
  Enum at_00;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 in_stack_fffffffffffffac4;
  FlowBuilder *in_stack_fffffffffffffac8;
  ExpressionDecomposer local_52c;
  unsigned_long local_528;
  Enum local_520;
  unsigned_long *in_stack_fffffffffffffb00;
  TestCaseData *in_stack_fffffffffffffb08;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffb68;
  char *in_stack_fffffffffffffb70;
  Executor *in_stack_fffffffffffffb78;
  __basic_future<void> local_480 [3];
  undefined1 *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char **local_430;
  ulong local_428;
  undefined1 local_420 [56];
  undefined1 local_3e8 [40];
  undefined1 local_3c0 [8];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [712];
  unsigned_long *local_e0;
  Enum local_d8;
  ExpressionDecomposer local_bc;
  unsigned_long *local_b8;
  Enum local_b0;
  ResultBuilder local_88;
  ulong local_10;
  char *local_8;
  
  local_10 = 0x10000;
  pRVar6 = (Result *)0x18308d;
  at_00 = DT_REQUIRE;
  local_8 = in_RDI;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
             (Enum)((ulong)in_stack_fffffffffffffa98 >> 0x20),in_stack_fffffffffffffa90,
             (int)((ulong)in_stack_fffffffffffffa88 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),"",
             (char *)CONCAT44(0xc,in_stack_fffffffffffffab0));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_bc,at_00);
  EVar4 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (unsigned_long *)pRVar6);
  local_e0 = EVar4.lhs;
  EVar2 = EVar4.m_at;
  local_d8 = EVar2;
  local_b8 = local_e0;
  local_b0 = EVar2;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            ((Expression_lhs<const_unsigned_long_&> *)in_stack_fffffffffffffb08,
             in_stack_fffffffffffffb00);
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),pRVar6);
  doctest::detail::Result::~Result((Result *)0x11924d);
  doctest::detail::ResultBuilder::log(&local_88,__x);
  uVar7 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffffaa0);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react
            ((ResultBuilder *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x119320);
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(EVar2,uVar7));
  tf::Taskflow::Taskflow((Taskflow *)CONCAT44(EVar2,uVar7));
  puVar3 = local_3b8;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),pRVar6);
  tf::Executor::Executor
            (in_stack_fffffffffffffb78,(size_t)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x119385);
  memset(local_3c0,0,8);
  std::mutex::mutex((mutex *)0x1193a6);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x1193b3);
  file = local_8;
  for (local_428 = 0; at = (Enum)((ulong)puVar3 >> 0x20), local_428 < local_10;
      local_428 = local_428 + 1) {
    local_450 = local_3e8;
    local_448 = local_420;
    local_440 = local_3a8;
    local_438 = local_3c0;
    local_430 = &local_8;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:444:22),_nullptr>
              (in_stack_fffffffffffffac8,
               (anon_class_40_5_c027369e *)
               CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  }
  tf::FlowBuilder::composed_of<tf::Taskflow>
            (in_stack_fffffffffffffac8,
             (Taskflow *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0));
  puVar3 = local_3a8;
  tf::Executor::run(in_stack_fffffffffffffa88,
                    (Taskflow *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  line = (int)((ulong)in_stack_fffffffffffffa88 >> 0x20);
  std::__basic_future<void>::wait(local_480,puVar3);
  tf::Future<void>::~Future
            ((Future<void> *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80));
  pRVar6 = (Result *)0x18308d;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)CONCAT44(EVar2,uVar7),at,file,line,
             (char *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),"",
             (char *)CONCAT44(at_00,in_stack_fffffffffffffab0));
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_52c,DT_REQUIRE);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::size
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             0x119575);
  EVar5 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                     (unsigned_long *)pRVar6);
  local_528 = EVar5.lhs;
  EVar2 = EVar5.m_at;
  local_520 = EVar2;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            ((Expression_lhs<const_unsigned_long> *)in_stack_fffffffffffffb08,
             in_stack_fffffffffffffb00);
  doctest::detail::ResultBuilder::setResult
            ((ResultBuilder *)CONCAT44(EVar2,in_stack_fffffffffffffa80),pRVar6);
  doctest::detail::Result::~Result((Result *)0x1195ef);
  doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffb08,__x_00);
  uVar7 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffffa80);
  if ((extraout_AL_00 & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)CONCAT44(EVar2,uVar7));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1196df);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   0x1196ee);
    tf::Executor::~Executor((Executor *)CONCAT44(at_00,in_stack_fffffffffffffab0));
    tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar2,uVar7));
    tf::Taskflow::~Taskflow((Taskflow *)CONCAT44(EVar2,uVar7));
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void embarrasing_starvation(size_t W) {

  size_t B = 65536;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow, parent;
  tf::Executor executor(W);

  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  // fork
  for(size_t b=0; b<B; b++) {
    taskflow.emplace([&](){
      // record worker
      {
        std::scoped_lock lock(mutex);
        set.insert(executor.this_worker_id());
      }

      // all threads should be notified
      barrier.fetch_add(1, std::memory_order_relaxed);
      while(barrier.load(std::memory_order_relaxed) < W) {
        std::this_thread::yield();
      }
    });
  }

  parent.composed_of(taskflow);

  executor.run(parent).wait();

  REQUIRE(set.size() == W);
}